

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall
duckdb::DictionaryAnalyzeState::AddNewString(DictionaryAnalyzeState *this,string_t str)

{
  anon_union_16_2_67f50693_for_value local_30;
  anon_union_16_2_67f50693_for_value local_20;
  
  local_30.pointer.ptr = (char *)str.value._8_8_;
  local_30._0_8_ = str.value._0_8_;
  this->current_tuple_count = this->current_tuple_count + 1;
  this->current_unique_count = this->current_unique_count + 1;
  this->current_dict_size = this->current_dict_size + (local_30._0_8_ & 0xffffffff);
  if (str.value._0_4_ < 0xd) {
    ::std::__detail::
    _Insert_base<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->current_set,(value_type *)&local_30.pointer);
  }
  else {
    local_20.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringHeap::AddBlob(&this->heap,(string_t *)&local_30.pointer);
    ::std::__detail::
    _Insert<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&this->current_set,(value_type *)&local_20.pointer);
  }
  this->current_width = this->next_width;
  return;
}

Assistant:

void DictionaryAnalyzeState::AddNewString(string_t str) {
	current_tuple_count++;
	current_unique_count++;
	current_dict_size += str.GetSize();
	if (str.IsInlined()) {
		current_set.insert(str);
	} else {
		current_set.insert(heap.AddBlob(str));
	}
	current_width = next_width;
}